

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_exponent_sign_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  int iVar1;
  error_code eStack_20;
  
  if ((this->super_matcher<pstore::json::null_output>).field_0xd == '\x01') {
    (this->fp_acc_).whole_part =
         ((double)CONCAT44(0x45300000,(int)(this->int_acc_ >> 0x20)) - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)this->int_acc_) - 4503599627370496.0);
    (this->super_matcher<pstore::json::null_output>).field_0xd = 0;
  }
  (this->super_matcher<pstore::json::null_output>).state_ = 9;
  if (c == '-') {
    (this->fp_acc_).exp_is_negative = true;
    return true;
  }
  if (c == '+') {
    (this->fp_acc_).exp_is_negative = false;
    return true;
  }
  iVar1 = (this->super_matcher<pstore::json::null_output>).state_;
  if (iVar1 - 9U < 2) {
    if ((this->super_matcher<pstore::json::null_output>).field_0xd == '\x01') {
      assert_failed("!is_integer_",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x2ac);
    }
    if ((byte)(c - 0x30U) < 10) {
      (this->fp_acc_).exponent = ((uint)(byte)c + (this->fp_acc_).exponent * 10) - 0x30;
      (this->super_matcher<pstore::json::null_output>).state_ = 10;
    }
    else {
      if (iVar1 != 9) {
        complete(this,parser);
        return false;
      }
      eStack_20._M_cat = get_error_category();
      eStack_20._M_value = 0xb;
      matcher<pstore::json::null_output>::set_error
                (&this->super_matcher<pstore::json::null_output>,parser,&eStack_20);
    }
    return true;
  }
  assert_failed("this->get_state () == exponent_digit_state || this->get_state () == exponent_initial_digit_state"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x2ab);
}

Assistant:

void number_matcher<Callbacks>::number_is_float () {
                if (is_integer_) {
                    fp_acc_.whole_part = static_cast<double> (int_acc_);
                    is_integer_ = false;
                }
            }